

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O0

basic_ostream<char,_std::char_traits<char>_> *
math::wide_integer::operator<<
          (basic_ostream<char,_std::char_traits<char>_> *out,
          uintwide_t<24U,_unsigned_char,_void,_false> *x)

{
  char fill_char_str;
  fmtflags __a;
  _Ios_Fmtflags _Var1;
  unsigned_fast_type field_width_00;
  iterator str_result_00;
  pointer pcVar2;
  iterator str_result_01;
  pointer pcVar3;
  iterator str_result_02;
  pointer pcVar4;
  ostream *poVar5;
  bool show_pos_00;
  bool show_base_00;
  bool is_uppercase_00;
  string local_270 [39];
  value_type local_249;
  undefined1 auStack_248 [8];
  string_storage_hex_type str_result_2;
  value_type local_219;
  undefined1 auStack_218 [8];
  string_storage_dec_type str_result_1;
  value_type local_1e9;
  undefined1 auStack_1e8 [8];
  string_storage_oct_type str_result;
  char fill_char_out;
  unsigned_fast_type field_width;
  uint_fast8_t base_rep;
  bool is_uppercase;
  bool show_base;
  bool show_pos;
  fmtflags my_flags;
  basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> ostr;
  uintwide_t<24U,_unsigned_char,_void,_false> *x_local;
  basic_ostream<char,_std::char_traits<char>_> *out_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&base_rep);
  __a = std::ios_base::flags((ios_base *)(out + *(long *)(*(long *)out + -0x18)));
  _Var1 = std::operator&(__a,_S_showpos);
  show_pos_00 = _Var1 == _S_showpos;
  _Var1 = std::operator&(__a,_S_showbase);
  show_base_00 = _Var1 == _S_showbase;
  _Var1 = std::operator&(__a,_S_uppercase);
  is_uppercase_00 = _Var1 == _S_uppercase;
  _Var1 = std::operator&(__a,_S_oct);
  if (_Var1 == _S_oct) {
    field_width._0_1_ = '\b';
  }
  else {
    _Var1 = std::operator&(__a,_S_hex);
    if (_Var1 == _S_hex) {
      field_width._0_1_ = '\x10';
    }
    else {
      field_width._0_1_ = '\n';
    }
  }
  field_width_00 = std::ios_base::width((ios_base *)(out + *(long *)(*(long *)out + -0x18)));
  fill_char_str = std::ios::fill();
  if ((char)field_width == '\b') {
    str_result.super_array<char,_40UL>.elems[8] = '\0';
    str_result.super_array<char,_40UL>.elems[9] = '\0';
    str_result.super_array<char,_40UL>.elems[10] = '\0';
    str_result.super_array<char,_40UL>.elems[0xb] = '\0';
    str_result.super_array<char,_40UL>.elems[0xc] = '\0';
    str_result.super_array<char,_40UL>.elems[0xd] = '\0';
    str_result.super_array<char,_40UL>.elems[0xe] = '\0';
    str_result.super_array<char,_40UL>.elems[0xf] = '\0';
    str_result.super_array<char,_40UL>.elems[0x10] = '\0';
    str_result.super_array<char,_40UL>.elems[0x11] = '\0';
    str_result.super_array<char,_40UL>.elems[0x12] = '\0';
    str_result.super_array<char,_40UL>.elems[0x13] = '\0';
    str_result.super_array<char,_40UL>.elems[0x14] = '\0';
    str_result.super_array<char,_40UL>.elems[0x15] = '\0';
    str_result.super_array<char,_40UL>.elems[0x16] = '\0';
    str_result.super_array<char,_40UL>.elems[0x17] = '\0';
    auStack_1e8[0] = '\0';
    auStack_1e8[1] = '\0';
    auStack_1e8[2] = '\0';
    auStack_1e8[3] = '\0';
    auStack_1e8[4] = '\0';
    auStack_1e8[5] = '\0';
    auStack_1e8[6] = '\0';
    auStack_1e8[7] = '\0';
    str_result.super_array<char,_40UL>.elems[0] = '\0';
    str_result.super_array<char,_40UL>.elems[1] = '\0';
    str_result.super_array<char,_40UL>.elems[2] = '\0';
    str_result.super_array<char,_40UL>.elems[3] = '\0';
    str_result.super_array<char,_40UL>.elems[4] = '\0';
    str_result.super_array<char,_40UL>.elems[5] = '\0';
    str_result.super_array<char,_40UL>.elems[6] = '\0';
    str_result.super_array<char,_40UL>.elems[7] = '\0';
    str_result.super_array<char,_40UL>.elems[0x18] = '\0';
    str_result.super_array<char,_40UL>.elems[0x19] = '\0';
    str_result.super_array<char,_40UL>.elems[0x1a] = '\0';
    str_result.super_array<char,_40UL>.elems[0x1b] = '\0';
    str_result.super_array<char,_40UL>.elems[0x1c] = '\0';
    str_result.super_array<char,_40UL>.elems[0x1d] = '\0';
    str_result.super_array<char,_40UL>.elems[0x1e] = '\0';
    str_result.super_array<char,_40UL>.elems[0x1f] = '\0';
    detail::fixed_static_array<char,_40U>::fixed_static_array
              ((fixed_static_array<char,_40U> *)auStack_1e8);
    local_1e9 = '\0';
    detail::array_detail::array<char,_40UL>::fill((array<char,_40UL> *)auStack_1e8,&local_1e9);
    str_result_00 = detail::array_detail::array<char,_40UL>::begin((array<char,_40UL> *)auStack_1e8)
    ;
    uintwide_t<96u,unsigned_short,void,false>::wr_string<char*>
              ((uintwide_t<96u,unsigned_short,void,false> *)x,str_result_00,'\b',show_base_00,
               show_pos_00,is_uppercase_00,field_width_00,fill_char_str);
    pcVar2 = detail::array_detail::array<char,_40UL>::data((array<char,_40UL> *)auStack_1e8);
    std::operator<<((ostream *)&base_rep,pcVar2);
  }
  else if ((char)field_width == '\n') {
    str_result_1.super_array<char,_38UL>.elems[8] = '\0';
    str_result_1.super_array<char,_38UL>.elems[9] = '\0';
    str_result_1.super_array<char,_38UL>.elems[10] = '\0';
    str_result_1.super_array<char,_38UL>.elems[0xb] = '\0';
    str_result_1.super_array<char,_38UL>.elems[0xc] = '\0';
    str_result_1.super_array<char,_38UL>.elems[0xd] = '\0';
    str_result_1.super_array<char,_38UL>.elems[0xe] = '\0';
    str_result_1.super_array<char,_38UL>.elems[0xf] = '\0';
    str_result_1.super_array<char,_38UL>.elems[0x10] = '\0';
    str_result_1.super_array<char,_38UL>.elems[0x11] = '\0';
    str_result_1.super_array<char,_38UL>.elems[0x12] = '\0';
    str_result_1.super_array<char,_38UL>.elems[0x13] = '\0';
    str_result_1.super_array<char,_38UL>.elems[0x14] = '\0';
    str_result_1.super_array<char,_38UL>.elems[0x15] = '\0';
    auStack_218[0] = '\0';
    auStack_218[1] = '\0';
    auStack_218[2] = '\0';
    auStack_218[3] = '\0';
    auStack_218[4] = '\0';
    auStack_218[5] = '\0';
    auStack_218[6] = '\0';
    auStack_218[7] = '\0';
    str_result_1.super_array<char,_38UL>.elems[0] = '\0';
    str_result_1.super_array<char,_38UL>.elems[1] = '\0';
    str_result_1.super_array<char,_38UL>.elems[2] = '\0';
    str_result_1.super_array<char,_38UL>.elems[3] = '\0';
    str_result_1.super_array<char,_38UL>.elems[4] = '\0';
    str_result_1.super_array<char,_38UL>.elems[5] = '\0';
    str_result_1.super_array<char,_38UL>.elems[6] = '\0';
    str_result_1.super_array<char,_38UL>.elems[7] = '\0';
    str_result_1.super_array<char,_38UL>.elems[0x16] = '\0';
    str_result_1.super_array<char,_38UL>.elems[0x17] = '\0';
    str_result_1.super_array<char,_38UL>.elems[0x18] = '\0';
    str_result_1.super_array<char,_38UL>.elems[0x19] = '\0';
    str_result_1.super_array<char,_38UL>.elems[0x1a] = '\0';
    str_result_1.super_array<char,_38UL>.elems[0x1b] = '\0';
    str_result_1.super_array<char,_38UL>.elems[0x1c] = '\0';
    str_result_1.super_array<char,_38UL>.elems[0x1d] = '\0';
    detail::fixed_static_array<char,_38U>::fixed_static_array
              ((fixed_static_array<char,_38U> *)auStack_218);
    local_219 = '\0';
    detail::array_detail::array<char,_38UL>::fill((array<char,_38UL> *)auStack_218,&local_219);
    str_result_01 = detail::array_detail::array<char,_38UL>::begin((array<char,_38UL> *)auStack_218)
    ;
    uintwide_t<96u,unsigned_short,void,false>::wr_string<char*>
              ((uintwide_t<96u,unsigned_short,void,false> *)x,str_result_01,'\n',show_base_00,
               show_pos_00,is_uppercase_00,field_width_00,fill_char_str);
    pcVar3 = detail::array_detail::array<char,_38UL>::data((array<char,_38UL> *)auStack_218);
    std::operator<<((ostream *)&base_rep,pcVar3);
  }
  else if ((char)field_width == '\x10') {
    str_result_2.super_array<char,_32UL>.elems[8] = '\0';
    str_result_2.super_array<char,_32UL>.elems[9] = '\0';
    str_result_2.super_array<char,_32UL>.elems[10] = '\0';
    str_result_2.super_array<char,_32UL>.elems[0xb] = '\0';
    str_result_2.super_array<char,_32UL>.elems[0xc] = '\0';
    str_result_2.super_array<char,_32UL>.elems[0xd] = '\0';
    str_result_2.super_array<char,_32UL>.elems[0xe] = '\0';
    str_result_2.super_array<char,_32UL>.elems[0xf] = '\0';
    str_result_2.super_array<char,_32UL>.elems[0x10] = '\0';
    str_result_2.super_array<char,_32UL>.elems[0x11] = '\0';
    str_result_2.super_array<char,_32UL>.elems[0x12] = '\0';
    str_result_2.super_array<char,_32UL>.elems[0x13] = '\0';
    str_result_2.super_array<char,_32UL>.elems[0x14] = '\0';
    str_result_2.super_array<char,_32UL>.elems[0x15] = '\0';
    str_result_2.super_array<char,_32UL>.elems[0x16] = '\0';
    str_result_2.super_array<char,_32UL>.elems[0x17] = '\0';
    auStack_248[0] = '\0';
    auStack_248[1] = '\0';
    auStack_248[2] = '\0';
    auStack_248[3] = '\0';
    auStack_248[4] = '\0';
    auStack_248[5] = '\0';
    auStack_248[6] = '\0';
    auStack_248[7] = '\0';
    str_result_2.super_array<char,_32UL>.elems[0] = '\0';
    str_result_2.super_array<char,_32UL>.elems[1] = '\0';
    str_result_2.super_array<char,_32UL>.elems[2] = '\0';
    str_result_2.super_array<char,_32UL>.elems[3] = '\0';
    str_result_2.super_array<char,_32UL>.elems[4] = '\0';
    str_result_2.super_array<char,_32UL>.elems[5] = '\0';
    str_result_2.super_array<char,_32UL>.elems[6] = '\0';
    str_result_2.super_array<char,_32UL>.elems[7] = '\0';
    detail::fixed_static_array<char,_32U>::fixed_static_array
              ((fixed_static_array<char,_32U> *)auStack_248);
    local_249 = '\0';
    detail::array_detail::array<char,_32UL>::fill((array<char,_32UL> *)auStack_248,&local_249);
    str_result_02 = detail::array_detail::array<char,_32UL>::begin((array<char,_32UL> *)auStack_248)
    ;
    uintwide_t<96u,unsigned_short,void,false>::wr_string<char*>
              ((uintwide_t<96u,unsigned_short,void,false> *)x,str_result_02,'\x10',show_base_00,
               show_pos_00,is_uppercase_00,field_width_00,fill_char_str);
    pcVar4 = detail::array_detail::array<char,_32UL>::data((array<char,_32UL> *)auStack_248);
    std::operator<<((ostream *)&base_rep,pcVar4);
  }
  std::__cxx11::ostringstream::str();
  poVar5 = std::operator<<(out,local_270);
  std::__cxx11::string::~string(local_270);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&base_rep);
  return poVar5;
}

Assistant:

auto operator<<(std::basic_ostream<char_type, traits_type>& out,
                  const uintwide_t<Width2, LimbType, AllocatorType, IsSigned>& x) -> std::basic_ostream<char_type, traits_type>&
  {
    std::basic_ostringstream<char_type, traits_type> ostr;

    const std::ios::fmtflags my_flags = out.flags();

    const auto show_pos     = ((my_flags & std::ios::showpos)   == std::ios::showpos);
    const auto show_base    = ((my_flags & std::ios::showbase)  == std::ios::showbase);
    const auto is_uppercase = ((my_flags & std::ios::uppercase) == std::ios::uppercase);

    auto base_rep = std::uint_fast8_t { };

    if     ((my_flags & std::ios::oct) == std::ios::oct) { base_rep = static_cast<std::uint_fast8_t>(UINT8_C( 8)); }
    else if((my_flags & std::ios::hex) == std::ios::hex) { base_rep = static_cast<std::uint_fast8_t>(UINT8_C(16)); }
    else                                                 { base_rep = static_cast<std::uint_fast8_t>(UINT8_C(10)); }

    const auto field_width   = static_cast<unsigned_fast_type>(out.width());
    const auto fill_char_out = static_cast<char>(out.fill());

    using local_wide_integer_type = uintwide_t<Width2, LimbType, AllocatorType, IsSigned>;

    if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(8)))
    {
      using string_storage_oct_type =
        std::conditional_t
          <local_wide_integer_type::my_width2 <= static_cast<size_t>(UINT32_C(2048)),
            detail::fixed_static_array <char,
                                        local_wide_integer_type::wr_string_max_buffer_size_oct()>,
            detail::fixed_dynamic_array<char,
                                        local_wide_integer_type::wr_string_max_buffer_size_oct(),
                                        typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                         std::allocator<void>,
                                                                                         AllocatorType>>::template rebind_alloc<typename local_wide_integer_type::limb_type>>>;

      // TBD: There is redundant storage of this kind both here
      // in this subroutine as well as in the wr_string method.
      string_storage_oct_type str_result { }; // LCOV_EXCL_LINE

      str_result.fill('\0');

      x.wr_string(str_result.begin(), base_rep, show_base, show_pos, is_uppercase, field_width, fill_char_out);

      static_cast<void>(ostr << str_result.data());
    }
    else if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(10)))
    {
      using string_storage_dec_type =
        std::conditional_t
          <local_wide_integer_type::my_width2 <= static_cast<size_t>(UINT32_C(2048)),
            detail::fixed_static_array <char,
                                        local_wide_integer_type::wr_string_max_buffer_size_dec()>,
            detail::fixed_dynamic_array<char,
                                        local_wide_integer_type::wr_string_max_buffer_size_dec(),
                                        typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                          std::allocator<void>,
                                                                                          AllocatorType>>::template rebind_alloc<typename local_wide_integer_type::limb_type>>>;

      // TBD: There is redundant storage of this kind both here
      // in this subroutine as well as in the wr_string method.
      string_storage_dec_type str_result { };

      str_result.fill('\0');

      x.wr_string(str_result.begin(), base_rep, show_base, show_pos, is_uppercase, field_width, fill_char_out);

      static_cast<void>(ostr << str_result.data());
    }
    else if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(16)))
    {
      using string_storage_hex_type =
        std::conditional_t
          <local_wide_integer_type::my_width2 <= static_cast<size_t>(UINT32_C(2048)),
            detail::fixed_static_array <char,
                                        local_wide_integer_type::wr_string_max_buffer_size_hex()>,
            detail::fixed_dynamic_array<char,
                                        local_wide_integer_type::wr_string_max_buffer_size_hex(),
                                        typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                         std::allocator<void>,
                                                                                         AllocatorType>>::template rebind_alloc<typename local_wide_integer_type::limb_type>>>;

      // TBD: There is redundant storage of this kind both here
      // in this subroutine as well as in the wr_string method.
      string_storage_hex_type str_result { };

      str_result.fill('\0');

      x.wr_string(str_result.begin(), base_rep, show_base, show_pos, is_uppercase, field_width, fill_char_out);

      static_cast<void>(ostr << str_result.data());
    }

    return (out << ostr.str());
  }